

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,WriteToEndpoint *w)

{
  Expression *pEVar1;
  char cVar2;
  WriteToEndpoint *pWVar3;
  long *plVar4;
  long lVar5;
  ArrayView<soul::Type> local_68;
  CompileMessage local_50;
  
  (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,(w->target).object);
  (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,(w->value).object);
  throwErrorIfNotReadableValue((w->value).object);
  pWVar3 = ASTUtilities::getTopLevelWriteToEndpoint(w);
  pEVar1 = (pWVar3->target).object;
  if (pEVar1 == (Expression *)0x0) {
    plVar4 = (long *)0x0;
  }
  else {
    plVar4 = (long *)__dynamic_cast(pEVar1,&AST::Expression::typeinfo,
                                    &AST::OutputEndpointRef::typeinfo,0);
  }
  if (plVar4 != (long *)0x0) {
    cVar2 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (cVar2 == '\0') {
      return;
    }
    if (*(EndpointDetails **)(plVar4[6] + 0x38) == (EndpointDetails *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    AST::EndpointDetails::getSampleArrayTypes
              ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_68,
               *(EndpointDetails **)(plVar4[6] + 0x38));
    expectSilentCastPossible
              (&(w->super_Expression).super_Statement.super_ASTObject.context,local_68,
               (w->value).object);
LAB_002089a2:
    std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
              ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_68);
    return;
  }
  pEVar1 = (pWVar3->target).object;
  if (pEVar1 == (Expression *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = __dynamic_cast(pEVar1,&AST::Expression::typeinfo,&AST::ArrayElementRef::typeinfo,0);
  }
  if (lVar5 != 0) {
    if (*(long *)(lVar5 + 0x30) == 0) {
      plVar4 = (long *)0x0;
    }
    else {
      plVar4 = (long *)__dynamic_cast(*(long *)(lVar5 + 0x30),&AST::Expression::typeinfo,
                                      &AST::OutputEndpointRef::typeinfo,0);
    }
    if (plVar4 != (long *)0x0) {
      cVar2 = (**(code **)(*plVar4 + 0x18))(plVar4);
      if (cVar2 == '\0') {
        return;
      }
      if (*(EndpointDetails **)(plVar4[6] + 0x38) == (EndpointDetails *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      AST::EndpointDetails::getResolvedDataTypes
                ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_68,
                 *(EndpointDetails **)(plVar4[6] + 0x38));
      expectSilentCastPossible
                (&(w->super_Expression).super_Statement.super_ASTObject.context,local_68,
                 (w->value).object);
      goto LAB_002089a2;
    }
  }
  CompileMessageHelpers::createMessage<>
            (&local_50,syntax,error,"The target for the write operator must be an output");
  AST::Context::throwError
            (&(w->super_Expression).super_Statement.super_ASTObject.context,&local_50,false);
}

Assistant:

void visit (AST::WriteToEndpoint& w) override
        {
            super::visit (w);

            throwErrorIfNotReadableValue (w.value);
            auto& topLevelWrite = ASTUtilities::getTopLevelWriteToEndpoint (w);

            // Either an OutputEndpointRef, or an ArrayElementRef of an OutputEndpointRef
            if (auto outputEndpoint = cast<AST::OutputEndpointRef> (topLevelWrite.target))
            {
                if (outputEndpoint->isResolved())
                    expectSilentCastPossible (w.context, outputEndpoint->output->getDetails().getSampleArrayTypes(), w.value);

                return;
            }

            if (auto arraySubscript = cast<AST::ArrayElementRef> (topLevelWrite.target))
            {
                if (auto outputEndpoint = cast<AST::OutputEndpointRef> (arraySubscript->object))
                {
                    if (outputEndpoint->isResolved())
                        expectSilentCastPossible (w.context, outputEndpoint->output->getDetails().getResolvedDataTypes(), w.value);

                    return;
                }
            }

            w.context.throwError (Errors::targetMustBeOutput());
            return;
        }